

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

int update_msacsr(CPUMIPSState_conflict10 *env,int action,int denormal)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = (uint)(env->active_tc).msa_fp_status.float_exception_flags;
  uVar3 = uVar2 | 0x10;
  if (denormal == 0) {
    uVar3 = uVar2;
  }
  uVar1 = ieee_ex_to_mips_mips64el(uVar3);
  uVar2 = (env->active_tc).msacsr;
  if ((uVar2 >> 0x18 & 1) != 0 && (uVar3 & 0x40) != 0) {
    if ((action & 2U) == 0) {
      uVar1 = uVar1 | 1;
    }
    else {
      uVar1 = uVar1 & 0xfffffffe;
    }
  }
  if (0x7f < uVar3 && (uVar2 >> 0x18 & 1) != 0) {
    if ((action & 1U) == 0) {
      uVar1 = uVar1 | 3;
    }
    else {
      uVar1 = (uVar1 & 0xfffffffc) + 1;
    }
  }
  uVar5 = (uint)((uVar2 >> 9 & 1) == 0 & (byte)uVar1 >> 2);
  uVar4 = uVar5 | uVar1;
  uVar3 = uVar1 & 0xfffffffc;
  if ((uVar5 != 0 || (uVar1 & 1) != 0) || (uVar2 & 0x100) != 0) {
    uVar3 = uVar4;
  }
  if ((uVar1 & 2) == 0) {
    uVar3 = uVar4;
  }
  uVar1 = 1;
  if ((uVar3 & 0x18) != 0) {
    uVar1 = uVar3;
  }
  if ((action & 4U) == 0) {
    uVar1 = uVar3;
  }
  if ((uVar1 & (uVar2 >> 7 & 0x1f | 0x20)) == 0) {
    uVar3 = uVar1 << 0xc;
  }
  else {
    if ((uVar2 >> 0x12 & 1) != 0) {
      return uVar1;
    }
    uVar3 = uVar1 << 0xc | uVar2;
    uVar2 = uVar2 & 0xfff80fff;
  }
  (env->active_tc).msacsr = uVar3 & 0x3f000 | uVar2;
  return uVar1;
}

Assistant:

static inline int update_msacsr(CPUMIPSState *env, int action, int denormal)
{
    int ieee_ex;

    int c;
    int cause;
    int enable;

    ieee_ex = get_float_exception_flags(&env->active_tc.msa_fp_status);

    /* QEMU softfloat does not signal all underflow cases */
    if (denormal) {
        ieee_ex |= float_flag_underflow;
    }

    c = ieee_ex_to_mips(ieee_ex);
    enable = GET_FP_ENABLE(env->active_tc.msacsr) | FP_UNIMPLEMENTED;

    /* Set Inexact (I) when flushing inputs to zero */
    if ((ieee_ex & float_flag_input_denormal) &&
            (env->active_tc.msacsr & MSACSR_FS_MASK) != 0) {
        if (action & CLEAR_IS_INEXACT) {
            c &= ~FP_INEXACT;
        } else {
            c |=  FP_INEXACT;
        }
    }

    /* Set Inexact (I) and Underflow (U) when flushing outputs to zero */
    if ((ieee_ex & float_flag_output_denormal) &&
            (env->active_tc.msacsr & MSACSR_FS_MASK) != 0) {
        c |= FP_INEXACT;
        if (action & CLEAR_FS_UNDERFLOW) {
            c &= ~FP_UNDERFLOW;
        } else {
            c |=  FP_UNDERFLOW;
        }
    }

    /* Set Inexact (I) when Overflow (O) is not enabled */
    if ((c & FP_OVERFLOW) != 0 && (enable & FP_OVERFLOW) == 0) {
        c |= FP_INEXACT;
    }

    /* Clear Exact Underflow when Underflow (U) is not enabled */
    if ((c & FP_UNDERFLOW) != 0 && (enable & FP_UNDERFLOW) == 0 &&
            (c & FP_INEXACT) == 0) {
        c &= ~FP_UNDERFLOW;
    }

    /*
     * Reciprocal operations set only Inexact when valid and not
     * divide by zero
     */
    if ((action & RECIPROCAL_INEXACT) &&
            (c & (FP_INVALID | FP_DIV0)) == 0) {
        c = FP_INEXACT;
    }

    cause = c & enable;    /* all current enabled exceptions */

    if (cause == 0) {
        /*
         * No enabled exception, update the MSACSR Cause
         * with all current exceptions
         */
        SET_FP_CAUSE(env->active_tc.msacsr,
                (GET_FP_CAUSE(env->active_tc.msacsr) | c));
    } else {
        /* Current exceptions are enabled */
        if ((env->active_tc.msacsr & MSACSR_NX_MASK) == 0) {
            /*
             * Exception(s) will trap, update MSACSR Cause
             * with all enabled exceptions
             */
            SET_FP_CAUSE(env->active_tc.msacsr,
                    (GET_FP_CAUSE(env->active_tc.msacsr) | c));
        }
    }

    return c;
}